

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

unsigned_long elf_numsegments(GlobalVars *gv)

{
  uint uVar1;
  ulong uVar2;
  Phdr *pPVar3;
  
  pPVar3 = gv->phdrlist;
  uVar2 = 0;
  if (pPVar3 != (Phdr *)0x0) {
    do {
      uVar1._0_2_ = pPVar3->flags;
      uVar1._2_1_ = pPVar3->alignment;
      uVar1._3_1_ = pPVar3->reserved;
      uVar1 = (int)uVar2 + (uint)((uVar1 >> 4 & 1) != 0);
      uVar2 = (ulong)uVar1;
      pPVar3 = pPVar3->next;
    } while (pPVar3 != (Phdr *)0x0);
    uVar2 = (ulong)(int)uVar1;
  }
  return uVar2;
}

Assistant:

unsigned long elf_numsegments(struct GlobalVars *gv)
{
  int segcnt = 0;
  struct Phdr *p = gv->phdrlist;

  while (p) {
    if (p->flags & PHDR_USED)
      segcnt++;
    p = p->next;
  }
  return segcnt;
}